

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

bool Assimp::Ogre::OgreBinarySerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  bool bVar1;
  Skeleton *this;
  MemoryStreamReaderPtr reader;
  OgreBinarySerializer serializer;
  
  if ((mesh != (Mesh *)0x0) && ((mesh->skeletonRef)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&serializer,".skeleton.xml",(allocator<char> *)&reader);
    bVar1 = EndsWith(&mesh->skeletonRef,(string *)&serializer,false);
    std::__cxx11::string::~string((string *)&serializer);
    if (!bVar1) {
      OpenReader((OgreBinarySerializer *)&reader,pIOHandler,&mesh->skeletonRef);
      bVar1 = reader.
              super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0;
      if (bVar1) {
        this = (Skeleton *)operator_new(0x38);
        Skeleton::Skeleton(this);
        serializer.m_currentLen = 0;
        serializer.m_reader =
             reader.
             super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        serializer.assetMode = AM_Skeleton;
        ReadSkeleton(&serializer,this);
        mesh->skeleton = this;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&reader.
                  super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return bVar1;
    }
    OgreXmlSerializer::ImportSkeleton(pIOHandler,mesh);
  }
  return false;
}

Assistant:

bool OgreBinarySerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // binary mesh referencing a XML skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton.xml", false))
    {
        OgreXmlSerializer::ImportSkeleton(pIOHandler, mesh);
        return false;
    }

    MemoryStreamReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader)
      return false;

    Skeleton *skeleton = new Skeleton();
    OgreBinarySerializer serializer(reader.get(), OgreBinarySerializer::AM_Skeleton);
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}